

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::DumpRange(Instr *this,Instr *instrEnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *local_40;
  Instr *local_30;
  Instr *instr;
  Instr *instrStop;
  Instr *__prevInstrCheck;
  Instr *instrEnd_local;
  Instr *this_local;
  
  Output::Print(L"-------------------------------------------------------------------------------\n"
               );
  instrStop = (Instr *)0x0;
  local_30 = this;
  if (instrEnd == (Instr *)0x0) {
    local_40 = (Instr *)0x0;
  }
  else {
    local_40 = instrEnd->m_next;
  }
  do {
    if (local_30 == local_40) {
      Output::Print(
                   L"-------------------------------------------------------------------------------\n"
                   );
      return;
    }
    if ((instrStop != (Instr *)0x0) && (instrStop->m_next != local_30)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x1320,
                         "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    instrStop = local_30;
    Dump(local_30);
    local_30 = local_30->m_next;
  } while( true );
}

Assistant:

void
Instr::DumpRange(Instr *instrEnd)
{
    Output::Print(_u("-------------------------------------------------------------------------------\n"));

    FOREACH_INSTR_IN_RANGE(instr, this, instrEnd)
    {
        instr->Dump();
    }
    NEXT_INSTR_IN_RANGE;

    Output::Print(_u("-------------------------------------------------------------------------------\n"));
}